

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  int local_f4;
  string local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0018a898;
  if (this->read_fd_ == -1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    goto LAB_00168753;
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"CHECK failed: File ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_b0 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = (ulong *)*plVar2;
  puVar5 = (ulong *)(plVar2 + 2);
  if (local_90 == puVar5) {
    local_80 = *puVar5;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar5;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_f4 = 0x191;
  StreamableToString<int>(&local_f0,&local_f4);
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < local_f0._M_string_length + local_88) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_f0._M_string_length + local_88) goto LAB_001685fb;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001685fb:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0._M_dataplus._M_p);
  }
  local_70 = (undefined8 *)*puVar3;
  puVar1 = puVar3 + 2;
  if (local_70 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar1;
  }
  local_68 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_30._M_dataplus._M_p = (pointer)*plVar2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_30._M_dataplus._M_p == psVar6) {
    local_30.field_2._M_allocated_capacity = *psVar6;
    local_30.field_2._8_8_ = plVar2[3];
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = *psVar6;
  }
  local_30._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    DeathTestAbort(&local_30);
  }
LAB_00168753:
  __stack_chk_fail();
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }